

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  BYTE *pBVar2;
  ZSTD_matchState_t *pZVar3;
  int iVar4;
  undefined8 uVar5;
  U32 UVar6;
  uint uVar7;
  uint uVar8;
  U32 UVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  seqDef *psVar13;
  uint uVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  long lVar18;
  BYTE *litEnd_1;
  int *ip;
  int *piVar19;
  int *ilimit_w;
  int *piVar20;
  ulong uVar21;
  BYTE *litEnd;
  int *iend;
  int iVar22;
  U32 local_b4;
  size_t offbaseFound;
  U32 local_9c;
  ulong local_98;
  ulong local_90;
  ZSTD_matchState_t *local_88;
  BYTE *litLimit_w;
  seqStore_t *local_78;
  BYTE *local_70;
  BYTE *local_68;
  int *local_60;
  ulong local_58;
  BYTE *local_50;
  BYTE *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar2 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  local_90 = (ulong)uVar8;
  local_70 = pBVar2 + local_90;
  uVar7 = (ms->cParams).minMatch;
  uVar14 = 6;
  if (uVar7 < 6) {
    uVar14 = uVar7;
  }
  uVar7 = 4;
  if (4 < uVar14) {
    uVar7 = uVar14;
  }
  pZVar3 = ms->dictMatchState;
  local_68 = (pZVar3->window).nextSrc;
  local_50 = (pZVar3->window).base;
  local_40 = local_50 + (pZVar3->window).dictLimit;
  local_58 = (ulong)(((int)local_50 - (int)local_68) + uVar8);
  local_b4 = *rep;
  UVar9 = rep[1];
  ms->lazySkipping = 0;
  local_48 = local_50 + -local_58;
  iEnd = (BYTE *)((long)src + srcSize);
  local_60 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  ip = (int *)((ulong)(((int)src - ((int)local_40 + (int)local_70)) + (int)local_68 == 0) +
              (long)src);
  local_88 = ms;
  local_78 = seqStore;
  local_38 = rep;
  do {
    while( true ) {
      local_9c = UVar9;
      if (local_60 <= ip) {
        *local_38 = local_b4;
        local_38[1] = local_9c;
        return (long)iEnd - (long)src;
      }
      iVar22 = (int)pBVar2;
      uVar8 = (((int)ip - iVar22) - local_b4) + 1;
      piVar20 = (int *)(pBVar2 + uVar8);
      if (uVar8 < (uint)local_90) {
        piVar20 = (int *)(local_50 + (uVar8 - (int)local_58));
      }
      if ((uVar8 - (uint)local_90 < 0xfffffffd) && (*piVar20 == *(int *)((long)ip + 1))) {
        pBVar15 = iEnd;
        if (uVar8 < (uint)local_90) {
          pBVar15 = local_68;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)ip + 5),(BYTE *)(piVar20 + 1),iEnd,pBVar15,local_70);
        uVar21 = sVar10 + 4;
      }
      else {
        uVar21 = 0;
      }
      offbaseFound = 999999999;
      if (uVar7 == 6) {
        uVar11 = ZSTD_HcFindBestMatch_dictMatchState_6(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (uVar7 == 5) {
        uVar11 = ZSTD_HcFindBestMatch_dictMatchState_5(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar11 = ZSTD_HcFindBestMatch_dictMatchState_4(ms,(BYTE *)ip,iEnd,&offbaseFound);
      }
      uVar12 = uVar21;
      if (uVar21 < uVar11) {
        uVar12 = uVar11;
      }
      if (3 < uVar12) break;
      local_88->lazySkipping = (uint)(0x7ff < (ulong)((long)ip - (long)src));
      ip = (int *)((long)ip + ((ulong)((long)ip - (long)src) >> 8) + 1);
      ms = local_88;
      UVar9 = local_9c;
    }
    sVar10 = 1;
    piVar20 = (int *)((long)ip + 1);
    if (uVar21 < uVar11) {
      sVar10 = offbaseFound;
      piVar20 = ip;
    }
LAB_00f45708:
    do {
      iend = piVar20;
      uVar21 = uVar12;
      piVar19 = ip;
      local_98 = sVar10;
      ilimit_w = (int *)litLimit_w;
      if (local_60 <= piVar19) break;
      ip = (int *)((long)piVar19 + 1);
      uVar8 = ((int)ip - iVar22) - local_b4;
      piVar20 = (int *)(pBVar2 + uVar8);
      if (uVar8 < (uint)local_90) {
        piVar20 = (int *)(local_50 + (uVar8 - (int)local_58));
      }
      if ((uVar8 - (uint)local_90 < 0xfffffffd) && (*piVar20 == *ip)) {
        pBVar15 = iEnd;
        if (uVar8 < (uint)local_90) {
          pBVar15 = local_68;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 5),(BYTE *)(piVar20 + 1),iEnd,pBVar15,local_70)
        ;
        if (sVar10 < 0xfffffffffffffffc) {
          uVar8 = 0x1f;
          if ((uint)local_98 != 0) {
            for (; (uint)local_98 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)uVar21 * 3 + -0x1e) < (int)(sVar10 + 4) * 3) {
            local_98 = 1;
            uVar21 = sVar10 + 4;
            iend = ip;
          }
        }
      }
      offbaseFound = 999999999;
      if (uVar7 == 6) {
        uVar12 = ZSTD_HcFindBestMatch_dictMatchState_6(local_88,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (uVar7 == 5) {
        uVar12 = ZSTD_HcFindBestMatch_dictMatchState_5(local_88,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar12 = ZSTD_HcFindBestMatch_dictMatchState_4(local_88,(BYTE *)ip,iEnd,&offbaseFound);
      }
      if (3 < uVar12) {
        uVar8 = 0x1f;
        if ((uint)local_98 != 0) {
          for (; (uint)local_98 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        iVar4 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar4 == 0; iVar4 = iVar4 + -1) {
          }
        }
        sVar10 = offbaseFound;
        piVar20 = ip;
        if ((int)((uVar8 ^ 0x1f) + (int)uVar21 * 4 + -0x1b) < (int)uVar12 * 4 - iVar4)
        goto LAB_00f45708;
      }
      ilimit_w = (int *)litLimit_w;
      if (local_60 <= ip) break;
      ip = (int *)((long)piVar19 + 2);
      uVar8 = ((int)ip - iVar22) - local_b4;
      piVar20 = (int *)(pBVar2 + uVar8);
      if (uVar8 < (uint)local_90) {
        piVar20 = (int *)(local_50 + (uVar8 - (int)local_58));
      }
      if ((uVar8 - (uint)local_90 < 0xfffffffd) && (*piVar20 == *ip)) {
        pBVar15 = iEnd;
        if (uVar8 < (uint)local_90) {
          pBVar15 = local_68;
        }
        sVar10 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar19 + 6),(BYTE *)(piVar20 + 1),iEnd,pBVar15,local_70)
        ;
        if (sVar10 < 0xfffffffffffffffc) {
          uVar8 = 0x1f;
          if ((uint)local_98 != 0) {
            for (; (uint)local_98 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)uVar21 * 4 + -0x1e) < (int)(sVar10 + 4) * 4) {
            local_98 = 1;
            uVar21 = sVar10 + 4;
            iend = ip;
          }
        }
      }
      ilimit_w = (int *)litLimit_w;
      offbaseFound = 999999999;
      if (uVar7 == 6) {
        uVar12 = ZSTD_HcFindBestMatch_dictMatchState_6(local_88,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else if (uVar7 == 5) {
        uVar12 = ZSTD_HcFindBestMatch_dictMatchState_5(local_88,(BYTE *)ip,iEnd,&offbaseFound);
      }
      else {
        uVar12 = ZSTD_HcFindBestMatch_dictMatchState_4(local_88,(BYTE *)ip,iEnd,&offbaseFound);
      }
      if (uVar12 < 4) break;
      uVar8 = 0x1f;
      if ((uint)local_98 != 0) {
        for (; (uint)local_98 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      iVar4 = 0x1f;
      if ((uint)offbaseFound != 0) {
        for (; (uint)offbaseFound >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      sVar10 = offbaseFound;
      piVar20 = ip;
    } while ((int)((uVar8 ^ 0x1f) + (int)uVar21 * 4 + -0x18) < (int)uVar12 * 4 - iVar4);
    if (3 < local_98) {
      pBVar16 = (BYTE *)((long)iend + (-0xfffffffd - (long)(pBVar2 + local_98)));
      pBVar17 = pBVar2;
      pBVar15 = local_70;
      if ((uint)pBVar16 < (uint)local_90) {
        pBVar17 = local_48;
        pBVar15 = local_40;
      }
      pBVar17 = pBVar17 + ((ulong)pBVar16 & 0xffffffff);
      for (; ((src < iend && (pBVar15 < pBVar17)) && (*(BYTE *)((long)iend + -1) == pBVar17[-1]));
          iend = (int *)((long)iend + -1)) {
        pBVar17 = pBVar17 + -1;
        uVar21 = uVar21 + 1;
      }
      local_9c = local_b4;
      local_b4 = (int)local_98 - 3;
    }
    uVar11 = (long)iend - (long)src;
    pBVar15 = local_78->lit;
    if (ilimit_w < iend) {
      ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)iend,(BYTE *)ilimit_w);
LAB_00f45a0d:
      local_78->lit = local_78->lit + uVar11;
      psVar13 = local_78->sequences;
      if (0xffff < uVar11) {
        local_78->longLengthType = ZSTD_llt_literalLength;
        local_78->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)local_78->sequencesStart) >> 3);
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar15 = *src;
      *(undefined8 *)(pBVar15 + 8) = uVar5;
      pBVar15 = local_78->lit;
      if (0x10 < uVar11) {
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar15 + 0x18) = uVar5;
        if (0x20 < (long)uVar11) {
          lVar18 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar18 + 0x20);
            uVar5 = puVar1[1];
            pBVar17 = pBVar15 + lVar18 + 0x20;
            *(undefined8 *)pBVar17 = *puVar1;
            *(undefined8 *)(pBVar17 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar18 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar17 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar17 + 0x18) = uVar5;
            lVar18 = lVar18 + 0x20;
          } while (pBVar17 + 0x20 < pBVar15 + uVar11);
        }
        goto LAB_00f45a0d;
      }
      local_78->lit = pBVar15 + uVar11;
      psVar13 = local_78->sequences;
    }
    ms = local_88;
    psVar13->litLength = (U16)uVar11;
    psVar13->offBase = (U32)local_98;
    if (0xffff < uVar21 - 3) {
      local_78->longLengthType = ZSTD_llt_matchLength;
      local_78->longLengthPos = (U32)((ulong)((long)psVar13 - (long)local_78->sequencesStart) >> 3);
    }
    psVar13->mlBase = (U16)(uVar21 - 3);
    local_78->sequences = psVar13 + 1;
    if (local_88->lazySkipping != 0) {
      local_88->lazySkipping = 0;
    }
    UVar6 = local_9c;
    for (src = (void *)((long)iend + uVar21); UVar9 = UVar6, ip = (int *)src, src <= local_60;
        src = (void *)((long)src + sVar10 + 4)) {
      uVar8 = ((int)src - iVar22) - UVar9;
      pBVar15 = pBVar2;
      if (uVar8 < (uint)local_90) {
        pBVar15 = local_48;
      }
      if ((0xfffffffc < uVar8 - (uint)local_90) || (*(int *)(pBVar15 + uVar8) != *src)) break;
      pBVar17 = iEnd;
      if (uVar8 < (uint)local_90) {
        pBVar17 = local_68;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar15 + uVar8) + 4),iEnd,pBVar17
                          ,local_70);
      pBVar15 = local_78->lit;
      if (litLimit_w < src) {
        ZSTD_safecopyLiterals(pBVar15,(BYTE *)src,(BYTE *)src,litLimit_w);
      }
      else {
        uVar5 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar15 = *src;
        *(undefined8 *)(pBVar15 + 8) = uVar5;
      }
      psVar13 = local_78->sequences;
      psVar13->litLength = 0;
      psVar13->offBase = 1;
      if (0xffff < sVar10 + 1) {
        local_78->longLengthType = ZSTD_llt_matchLength;
        local_78->longLengthPos =
             (U32)((ulong)((long)psVar13 - (long)local_78->sequencesStart) >> 3);
      }
      psVar13->mlBase = (U16)(sVar10 + 1);
      local_78->sequences = psVar13 + 1;
      UVar6 = local_b4;
      local_b4 = UVar9;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2, ZSTD_dictMatchState);
}